

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

gbstatus_e ppu_init(gb_ppu_t *ppu,gb *gb)

{
  uint8_t *puVar1;
  char *pcVar2;
  gbstatus_e status;
  gb *gb_local;
  gb_ppu_t *ppu_local;
  
  if (ppu == (gb_ppu_t *)0x0) {
    __assert_fail("ppu != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                  ,0x60,"gbstatus_e ppu_init(gb_ppu_t *, struct gb *)");
  }
  if (gb != (gb *)0x0) {
    ppu->gb = gb;
    puVar1 = (uint8_t *)calloc(0x2000,1);
    ppu->vram = puVar1;
    if (ppu->vram == (uint8_t *)0x0) {
      snprintf(gbstatus_str,100,"unable to allocate memory");
    }
    else {
      puVar1 = (uint8_t *)calloc(0xa0,1);
      ppu->oam = puVar1;
      if (ppu->oam == (uint8_t *)0x0) {
        snprintf(gbstatus_str,100,"unable to allocate memory");
      }
      else {
        pcVar2 = (char *)calloc(0x5a00,1);
        ppu->framebuffer = pcVar2;
        if (ppu->framebuffer == (char *)0x0) {
          snprintf(gbstatus_str,100,"unable to allocate memory");
        }
        else {
          pcVar2 = (char *)calloc(0xa0,1);
          ppu->bg_scanline_buffer = pcVar2;
          if (ppu->bg_scanline_buffer != (char *)0x0) {
            ppu_reset(ppu);
            return GBSTATUS_OK;
          }
          snprintf(gbstatus_str,100,"unable to allocate memory");
          free(ppu->framebuffer);
        }
        free(ppu->oam);
      }
      free(ppu->vram);
    }
    return GBSTATUS_BAD_ALLOC;
  }
  __assert_fail("gb != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                ,0x61,"gbstatus_e ppu_init(gb_ppu_t *, struct gb *)");
}

Assistant:

gbstatus_e ppu_init(gb_ppu_t *ppu, struct gb *gb)
{
    gbstatus_e status = GBSTATUS_OK;

    assert(ppu != NULL);
    assert(gb != NULL);

    ppu->gb = gb;

    ppu->vram = calloc(VRAM_SIZE, sizeof(uint8_t));
    if (ppu->vram == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler0;
    }

    ppu->oam = calloc(OAM_SIZE, sizeof(uint8_t));
    if (ppu->oam == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler1;
    }

    ppu->framebuffer = calloc(GB_SCREEN_WIDTH * GB_SCREEN_HEIGHT, sizeof(char));
    if (ppu->framebuffer == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler2;
    }

    ppu->bg_scanline_buffer = calloc(GB_SCREEN_WIDTH, sizeof(char));
    if (ppu->bg_scanline_buffer == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler3;
    }

    ppu_reset(ppu);
    return GBSTATUS_OK;

error_handler3:
    free(ppu->framebuffer);

error_handler2:
    free(ppu->oam);

error_handler1:
    free(ppu->vram);

error_handler0:
    return status;
}